

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O0

void UnitTest::unittest_assert(bool cond,char *code,char *file,int line)

{
  _UnitTest_Compare local_90;
  int local_7c;
  char *pcStack_78;
  int line_local;
  char *file_local;
  char *code_local;
  bool cond_local;
  char *pcStack_60;
  _UnitTest_Compare *local_58;
  char *local_50;
  _UnitTest_Compare *local_48;
  char *local_40;
  _UnitTest_Compare *local_38;
  char *local_30;
  _UnitTest_Compare *local_28;
  _UnitTest_Compare *local_20;
  undefined8 local_10;
  size_t _ip;
  
  if (!cond) {
    if ((global_unit_test_object_[8] & 1) == 0) {
      local_10 = 0x105ab0;
      local_90.m_ip = 0x105ab0;
      local_90.m_failed = true;
      local_7c = line;
      pcStack_78 = file;
      file_local = code;
      code_local._3_1_ = cond;
      code_local._4_4_ = line;
      pcStack_60 = file;
      local_58 = &local_90;
      _UnitTest_Compare::printFirst();
      _UnitTest_Compare::printPosition(&local_90,pcStack_60,code_local._4_4_);
      local_30 = "assert(";
      local_28 = &local_90;
      if ((local_90.m_failed & 1U) != 0) {
        _UnitTest_Compare::print("assert(");
      }
      local_40 = file_local;
      local_38 = &local_90;
      if ((local_90.m_failed & 1U) != 0) {
        _UnitTest_Compare::print(file_local);
      }
      local_50 = ") failed.";
      local_48 = &local_90;
      if ((local_90.m_failed & 1U) != 0) {
        _UnitTest_Compare::print(") failed.");
      }
      local_20 = &local_90;
      if ((local_90.m_failed & 1U) != 0) {
        _UnitTest_Compare::printLast();
      }
    }
    else {
      global_unit_test_object_._4_4_ = global_unit_test_object_._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void unittest_assert(bool cond, const char *code, const char *file, int line) {
  if (!cond) {
    if (global_unit_test_object_.expect_assert_failure) {
      ++global_unit_test_object_.assert_failure;
    } else {
      _UnitTest_Compare(file, line) << "assert(" << code << ") failed.";
    }
  }
}